

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>::relocate
          (QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_> *this,
          qsizetype offset,pair<BuildsMetaMakefileGenerator::Build_*,_ProString> **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_> *in_RDI;
  pair<BuildsMetaMakefileGenerator::Build_*,_ProString> **unaff_retaddr;
  pair<BuildsMetaMakefileGenerator::Build_*,_ProString> *res;
  pair<BuildsMetaMakefileGenerator::Build_*,_ProString> *first;
  QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::
  q_relocate_overlap_n<std::pair<BuildsMetaMakefileGenerator::Build*,ProString>,long_long>
            (first,(longlong)in_RDI,
             (pair<BuildsMetaMakefileGenerator::Build_*,_ProString> *)0x1dbe34);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build*,ProString>>,std::pair<BuildsMetaMakefileGenerator::Build*,ProString>const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x38 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }